

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  uint8_t prev_byte;
  ulong uVar1;
  Command *p;
  H10 *p_00;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ZopfliNode *array;
  ulong uVar5;
  uint32_t *puVar6;
  size_t sVar7;
  Command *__dest;
  BrotliEncoderState *s;
  char cVar8;
  uint uVar9;
  uint32_t uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint8_t *num_commands;
  ContextType literal_context_mode;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t out_size;
  ulong uVar26;
  size_t __n;
  bool bVar27;
  int in_stack_fffffffffffffd68;
  uint8_t last_byte;
  uint8_t last_byte_bits;
  ulong *local_288;
  Command *local_280;
  ulong local_278;
  uint8_t *local_270;
  ulong local_268;
  ulong local_260;
  H10 *local_258;
  uint8_t *local_250;
  ulong local_248;
  uint8_t *local_240;
  ulong local_238;
  ulong local_230;
  int dist_cache [4];
  ulong local_218;
  size_t local_210;
  uint8_t *local_208;
  size_t num_literals;
  int saved_dist_cache [4];
  uint8_t *local_1d0;
  ulong local_1b8;
  uint local_198;
  size_t last_insert_len;
  MemoryManager memory_manager;
  uint8_t *next_in;
  int local_168;
  int local_164;
  size_t local_160;
  int local_158;
  ulong local_150;
  uint8_t *local_148;
  ulong local_140;
  uint8_t *local_138;
  ulong local_130;
  ulong local_128;
  uint8_t *local_120;
  ulong local_118;
  size_t available_in;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  uVar17 = *encoded_size;
  local_288 = encoded_size;
  local_270 = input_buffer;
  sVar4 = BrotliEncoderMaxCompressedSize(input_size);
  iVar2 = 0;
  if (uVar17 != 0) {
    if (input_size == 0) {
      *local_288 = 1;
      *encoded_buffer = '\x06';
      iVar2 = 1;
    }
    else {
      local_248 = input_size;
      if (quality == 10) {
        iVar2 = 0x10;
        if (0x10 < lgwin) {
          iVar2 = lgwin;
        }
        iVar15 = 0x18;
        if (iVar2 < 0x18) {
          iVar15 = iVar2;
        }
        uVar13 = 1L << ((byte)iVar15 & 0x3f);
        cVar8 = '\x17';
        if (iVar2 < 0x17) {
          cVar8 = (char)iVar2;
        }
        uVar23 = 1L << (cVar8 + 1U & 0x3f);
        next_in = (uint8_t *)0xa00000000;
        local_160 = 0;
        local_158 = 0;
        dist_cache[0] = 4;
        dist_cache[1] = 0xb;
        dist_cache[2] = 0xf;
        dist_cache[3] = 0x10;
        saved_dist_cache[0] = 4;
        saved_dist_cache[1] = 0xb;
        saved_dist_cache[2] = 0xf;
        saved_dist_cache[3] = 0x10;
        local_164 = 0x12;
        if (iVar2 < 0x12) {
          local_164 = iVar2;
        }
        local_140 = 1L << ((byte)local_164 & 0x3f);
        local_1b8 = 0;
        local_168 = iVar15;
        BrotliInitMemoryManager
                  (&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (0x8000000000000000 < local_248) {
          __assert_fail("input_size <= mask + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                        ,0x429,
                        "int BrotliCompressBufferQuality10(int, size_t, const uint8_t *, size_t *, uint8_t *)"
                       );
        }
        local_148 = (uint8_t *)(uVar23 >> 3);
        uVar24 = uVar13;
        if (local_248 < uVar13) {
          uVar24 = local_248;
        }
        local_150 = uVar23;
        EncodeWindowBits(iVar15,&last_byte,&last_byte_bits);
        local_258 = (H10 *)BrotliAllocate(&memory_manager,0x80028);
        local_258->forest_ = (uint32_t *)0x0;
        local_258->forest_size_ = 0;
        local_258->is_dirty_ = 1;
        bVar27 = true;
        InitH10(&memory_manager,local_258,(uint8_t *)&next_in,(BrotliEncoderParams *)0x0,uVar24,1,
                in_stack_fffffffffffffd68);
        prev_byte = '\0';
        uVar23 = 0;
        local_218 = 0;
        local_1d0 = encoded_buffer;
        puVar11 = local_270;
        while ((p_00 = local_258, bVar27 && (uVar23 < local_248))) {
          local_130 = local_150 + uVar23;
          if (local_248 < local_150 + uVar23) {
            local_130 = local_248;
          }
          last_insert_len = 0;
          num_literals = 0;
          local_138 = (uint8_t *)((local_130 - uVar23) / 0xc + 0x10);
          local_240 = (uint8_t *)0x0;
          local_210 = 0;
          local_208 = (uint8_t *)0x0;
          local_280 = (Command *)0x0;
          local_238 = uVar23;
          do {
            uVar24 = local_130 - uVar23;
            puVar14 = local_240;
            if (local_130 < uVar23 || uVar24 == 0) break;
            if (local_140 <= uVar24) {
              uVar24 = local_140;
            }
            array = (ZopfliNode *)BrotliAllocate(&memory_manager,(uVar24 + 1) * 0x10);
            BrotliInitZopfliNodes(array,uVar24 + 1);
            if ((0x7f < uVar23) && (2 < uVar24)) {
              uVar16 = uVar23 - 0x7f;
              local_128 = (uVar24 + uVar23) - 0x7f;
              if (uVar23 < local_128) {
                local_128 = uVar23;
              }
              for (; uVar16 < local_128; uVar16 = uVar16 + 1) {
                uVar1 = local_258->window_mask_;
                local_118 = uVar23 - uVar16;
                if (uVar23 - uVar16 < 0x10) {
                  local_118 = 0xf;
                }
                local_118 = uVar1 - local_118;
                local_250 = puVar11 + (uVar16 & 0x7fffffffffffffff);
                uVar9 = (uint)(*(int *)(puVar11 + (uVar16 & 0x7fffffffffffffff)) * 0x1e35a7bd) >>
                        0xf;
                uVar3 = local_258->buckets_[uVar9];
                local_260 = (uVar1 & uVar16) * 2 + 1;
                local_268 = (uVar1 & uVar16) * 2;
                local_258->buckets_[uVar9] = (uint32_t)uVar16;
                local_120 = puVar11 + (uVar16 & 0x7fffffffffffffff);
                uVar26 = 0;
                uVar12 = 0;
                lVar21 = 0x40;
                while( true ) {
                  uVar25 = (ulong)uVar3;
                  if (uVar16 == uVar25) break;
                  bVar27 = lVar21 == 0;
                  lVar21 = lVar21 + -1;
                  if ((local_118 < uVar16 - uVar25) || (bVar27)) break;
                  uVar5 = uVar12;
                  if (uVar26 < uVar12) {
                    uVar5 = uVar26;
                  }
                  if (0x80 < uVar5) {
                    __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                  ,0x9d,
                                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                                 );
                  }
                  puVar14 = puVar11 + uVar25;
                  uVar22 = 0x80 - uVar5;
                  uVar25 = (ulong)((uint)uVar22 & 0xf8);
                  uVar20 = 0;
                  lVar18 = 0;
LAB_00128f67:
                  if (uVar22 >> 3 == uVar20) {
                    uVar19 = (ulong)((uint)uVar22 & 7);
                    puVar11 = puVar14 + (uVar5 - lVar18);
                    for (; (bVar27 = uVar19 != 0, uVar19 = uVar19 - 1, uVar20 = uVar22, bVar27 &&
                           (uVar20 = uVar25, local_120[uVar25 + uVar5] == *puVar11));
                        uVar25 = uVar25 + 1) {
                      puVar11 = puVar11 + 1;
                    }
                  }
                  else {
                    if (*(ulong *)(puVar14 + uVar20 * 8 + uVar5) ==
                        *(ulong *)(local_120 + uVar20 * 8 + uVar5)) goto code_r0x00128f7d;
                    uVar20 = *(ulong *)(local_120 + uVar20 * 8 + uVar5) ^
                             *(ulong *)(puVar14 + uVar20 * 8 + uVar5);
                    uVar25 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar20 = (uVar25 >> 3 & 0x1fffffff) - lVar18;
                  }
                  uVar20 = uVar20 + uVar5;
                  local_230 = uVar12;
                  iVar2 = bcmp(local_250,puVar14,uVar20);
                  if (iVar2 != 0) {
                    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                  ,0xa2,
                                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                                 );
                  }
                  local_198 = (uint)uVar1;
                  puVar11 = local_270;
                  if (0x7f < uVar20) {
                    puVar6 = local_258->forest_;
                    puVar6[local_268] = puVar6[(ulong)(local_198 & uVar3) * 2];
                    uVar10 = puVar6[(ulong)(local_198 & uVar3) * 2 + 1];
                    goto LAB_001290a7;
                  }
                  uVar25 = (ulong)(uVar3 & local_198) * 2;
                  puVar6 = local_258->forest_;
                  if (puVar14[uVar20] < local_250[uVar20]) {
                    puVar6[local_268] = uVar3;
                    uVar25 = uVar25 | 1;
                    uVar12 = local_230;
                    uVar26 = uVar20;
                    local_268 = uVar25;
                  }
                  else {
                    puVar6[local_260] = uVar3;
                    uVar12 = uVar20;
                    local_260 = uVar25;
                  }
                  uVar3 = puVar6[uVar25];
                }
                uVar10 = local_258->invalid_pos_;
                puVar6 = local_258->forest_;
                puVar6[local_268] = uVar10;
LAB_001290a7:
                puVar6[local_260] = uVar10;
              }
            }
            sVar7 = BrotliZopfliComputeShortestPath
                              (&memory_manager,uVar24,uVar23,puVar11,0x7fffffffffffffff,
                               (BrotliEncoderParams *)&next_in,uVar13 - 0x10,dist_cache,local_258,
                               array);
            puVar14 = local_240 + sVar7 + 1;
            if (local_240 + sVar7 + 1 < local_138) {
              puVar14 = local_138;
            }
            __dest = local_280;
            if ((local_208 != puVar14) &&
               (__dest = (Command *)BrotliAllocate(&memory_manager,(long)puVar14 << 4),
               p = local_280, local_208 = puVar14, local_280 != (Command *)0x0)) {
              memcpy(__dest,local_280,(long)local_240 << 4);
              BrotliFree(&memory_manager,p);
            }
            local_250 = local_240 + sVar7;
            local_280 = __dest;
            BrotliZopfliCreateCommands
                      (uVar24,uVar23,uVar13 - 0x10,array,dist_cache,&last_insert_len,
                       __dest + (long)local_240,&num_literals);
            local_210 = local_210 + uVar24;
            BrotliFree(&memory_manager,array);
            puVar14 = local_250;
            if (local_148 < local_250) break;
            uVar23 = uVar23 + uVar24;
            local_240 = local_250;
          } while (num_literals <= local_148);
          num_commands = puVar14;
          if (last_insert_len != 0) {
            local_280[(long)puVar14].insert_len_ = (uint32_t)last_insert_len;
            local_280[(long)puVar14].copy_len_ = 0x4000000;
            local_280[(long)puVar14].dist_extra_ = 0;
            local_280[(long)puVar14].dist_prefix_ = 0x10;
            if (last_insert_len < 6) {
              uVar23 = last_insert_len & 0xffffffff;
            }
            else if (last_insert_len < 0x82) {
              uVar3 = 0x1f;
              uVar9 = (uint)(last_insert_len - 2);
              if (uVar9 != 0) {
                for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              uVar23 = (ulong)((int)(last_insert_len - 2 >>
                                    ((char)(uVar3 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                               (uVar3 ^ 0xffffffe0) * 2 + 0x40);
            }
            else if (last_insert_len < 0x842) {
              uVar9 = (uint32_t)last_insert_len - 0x42;
              uVar3 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              uVar23 = (ulong)((uVar3 ^ 0xffe0) + 0x2a);
            }
            else {
              uVar23 = 0x15;
              if (0x1841 < last_insert_len) {
                uVar23 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
              }
            }
            num_commands = puVar14 + 1;
            local_280[(long)puVar14].cmd_prefix_ =
                 (short)uVar23 * 8 & 0x38U |
                 *(ushort *)
                  (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar23 & 0xffff) >> 3) * 3) * 2)
                 | 2;
            num_literals = num_literals + last_insert_len;
          }
          uVar23 = local_210 + local_238;
          local_278 = (ulong)last_byte_bits;
          if (local_210 == 0) {
            puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
            *puVar14 = last_byte;
            *(ulong *)(puVar14 + (local_278 >> 3)) =
                 3L << ((byte)local_278 & 7) | (ulong)puVar14[local_278 >> 3];
            local_278 = (ulong)((int)local_278 + 9U & 0xfffffff8);
          }
          else {
            local_230 = (ulong)(uVar23 == local_248);
            iVar2 = ShouldCompress(puVar11,0x7fffffffffffffff,local_238,local_210,num_literals,
                                   (size_t)num_commands);
            if (iVar2 == 0) {
              dist_cache[0] = saved_dist_cache[0];
              dist_cache[1] = saved_dist_cache[1];
              dist_cache[2] = saved_dist_cache[2];
              dist_cache[3] = saved_dist_cache[3];
              puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,local_210 + 0x10);
              *puVar14 = last_byte;
              BrotliStoreUncompressedMetaBlock
                        ((int)local_230,puVar11,local_238,0x7fffffffffffffff,local_210,&local_278,
                         puVar14);
            }
            else {
              local_260 = uVar23;
              BrotliInitBlockSplit((BlockSplit *)&available_in);
              BrotliInitBlockSplit(&local_e0);
              BrotliInitBlockSplit(&local_b0);
              uVar23 = local_238;
              local_40 = (HistogramDistance *)0x0;
              sStack_38 = 0;
              local_50 = (HistogramCommand *)0x0;
              sStack_48 = 0;
              local_60 = (HistogramLiteral *)0x0;
              sStack_58 = 0;
              local_70 = (uint32_t *)0x0;
              sStack_68 = 0;
              local_80 = (uint32_t *)0x0;
              sStack_78 = 0;
              iVar2 = BrotliIsMostlyUTF8(puVar11,local_238,0x7fffffffffffffff,local_210,0.75);
              literal_context_mode = (iVar2 == 0) + CONTEXT_UTF8;
              local_268 = local_1b8;
              local_250 = num_commands;
              BrotliBuildMetaBlock
                        (&memory_manager,puVar11,uVar23,0x7fffffffffffffff,
                         (BrotliEncoderParams *)&next_in,prev_byte,(uint8_t)local_1b8,local_280,
                         (size_t)num_commands,literal_context_mode,(MetaBlockSplit *)&available_in);
              BrotliOptimizeHistograms(0,0,(MetaBlockSplit *)&available_in);
              puVar14 = (uint8_t *)0x0;
              sVar7 = local_210 * 2 + 0x1f6;
              if (sVar7 != 0) {
                puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,sVar7);
              }
              uVar23 = local_238;
              puVar11 = local_270;
              *puVar14 = last_byte;
              iVar2 = (int)local_230;
              BrotliStoreMetaBlock
                        (&memory_manager,local_270,local_238,local_210,0x7fffffffffffffff,prev_byte,
                         (uint8_t)local_268,iVar2,0,0,literal_context_mode,local_280,
                         (size_t)local_250,(MetaBlockSplit *)&available_in,&local_278,puVar14);
              if (local_210 + 4 < local_278 >> 3) {
                dist_cache[0] = saved_dist_cache[0];
                dist_cache[1] = saved_dist_cache[1];
                dist_cache[2] = saved_dist_cache[2];
                dist_cache[3] = saved_dist_cache[3];
                *puVar14 = last_byte;
                local_278 = (ulong)last_byte_bits;
                BrotliStoreUncompressedMetaBlock
                          (iVar2,puVar11,uVar23,0x7fffffffffffffff,local_210,&local_278,puVar14);
              }
              BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
              BrotliDestroyBlockSplit(&memory_manager,&local_e0);
              BrotliDestroyBlockSplit(&memory_manager,&local_b0);
              BrotliFree(&memory_manager,local_80);
              local_80 = (uint32_t *)0x0;
              BrotliFree(&memory_manager,local_70);
              local_70 = (uint32_t *)0x0;
              BrotliFree(&memory_manager,local_60);
              local_60 = (HistogramLiteral *)0x0;
              BrotliFree(&memory_manager,local_50);
              local_50 = (HistogramCommand *)0x0;
              BrotliFree(&memory_manager,local_40);
              uVar23 = local_260;
            }
          }
          uVar24 = local_278 >> 3;
          last_byte = puVar14[uVar24];
          last_byte_bits = (byte)local_278 & 7;
          local_1b8 = (ulong)puVar11[uVar23 - 2];
          prev_byte = puVar11[uVar23 - 1];
          saved_dist_cache[0] = dist_cache[0];
          saved_dist_cache[1] = dist_cache[1];
          saved_dist_cache[2] = dist_cache[2];
          saved_dist_cache[3] = dist_cache[3];
          local_218 = local_218 + uVar24;
          bVar27 = local_218 <= uVar17;
          if (bVar27) {
            memcpy(local_1d0,puVar14,uVar24);
            local_1d0 = local_1d0 + uVar24;
          }
          BrotliFree(&memory_manager,puVar14);
          BrotliFree(&memory_manager,local_280);
        }
        *local_288 = local_218;
        CleanupH10(&memory_manager,local_258);
        BrotliFree(&memory_manager,p_00);
        if (bVar27) {
          if (sVar4 == 0) {
            return 1;
          }
          if (*local_288 <= sVar4) {
            return 1;
          }
        }
      }
      else {
        s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (s == (BrotliEncoderState *)0x0) {
          return 0;
        }
        available_in = local_248;
        next_in = local_270;
        memory_manager.alloc_func = (brotli_alloc_func)*local_288;
        saved_dist_cache[0] = 0;
        saved_dist_cache[1] = 0;
        dist_cache._0_8_ = encoded_buffer;
        if (s->is_initialized_ == 0) {
          (s->params).quality = quality;
          (s->params).lgwin = lgwin;
          (s->params).mode = mode;
          (s->params).size_hint = local_248 & 0xffffffff;
        }
        iVar2 = BrotliEncoderCompressStream
                          (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,
                           (size_t *)&memory_manager,(uint8_t **)dist_cache,
                           (size_t *)saved_dist_cache);
        if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
          iVar2 = 0;
        }
        *local_288 = saved_dist_cache._0_8_;
        BrotliEncoderDestroyInstance(s);
        if ((iVar2 != 0) && ((sVar4 == 0 || (*local_288 <= sVar4)))) {
          return 1;
        }
      }
      *local_288 = 0;
      iVar2 = 0;
      if (sVar4 - 1 < uVar17) {
        encoded_buffer[0] = '!';
        encoded_buffer[1] = '\x03';
        lVar21 = 2;
        iVar2 = 1;
        lVar18 = 0;
        for (uVar17 = local_248; uVar17 != 0; uVar17 = uVar17 - __n) {
          __n = 0x1000000;
          if (uVar17 < 0x1000000) {
            __n = uVar17;
          }
          iVar15 = 2 - (uint)(uVar17 < 0x100001);
          if (uVar17 < 0x10001) {
            iVar15 = 0;
          }
          uVar9 = ((int)__n * 8 + iVar15 * 2) - 8;
          uVar3 = 0x80000 << ((byte)(iVar15 << 2) & 0x1f) | uVar9;
          encoded_buffer[lVar21] = (uint8_t)uVar9;
          encoded_buffer[lVar21 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
          encoded_buffer[lVar21 + 2] = (uint8_t)(uVar3 >> 0x10);
          if (uVar17 < 0x100001) {
            lVar21 = lVar21 + 3;
          }
          else {
            encoded_buffer[lVar21 + 3] = (uint8_t)(uVar3 >> 0x18);
            lVar21 = lVar21 + 4;
          }
          memcpy(encoded_buffer + lVar21,local_270 + lVar18,__n);
          lVar21 = lVar21 + __n;
          lVar18 = lVar18 + __n;
        }
        encoded_buffer[lVar21] = '\x03';
        *local_288 = lVar21 + 1;
      }
    }
  }
  return iVar2;
code_r0x00128f7d:
  lVar18 = lVar18 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_00128f67;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}